

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O2

int ConvolutionReverb::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  Channel *pCVar1;
  float fVar2;
  uint numsamples;
  int iVar3;
  float *pfVar4;
  UnityComplexNumber *pUVar5;
  EffectData *data;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  UnityComplexNumber *b;
  uint uVar10;
  float *pfVar11;
  UnityComplexNumber *c;
  UnityComplexNumber *a;
  int k;
  uint uVar12;
  long lVar13;
  int n;
  long lVar14;
  float fVar15;
  MutexScopeLock mutexScope1;
  MutexScopeLock local_70;
  long local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  float *local_40;
  float *local_38;
  
  uVar7 = (ulong)(uint)outchannels;
  data = UnityAudioEffectState::GetEffectData<ConvolutionReverb::EffectData>(state);
  fVar2 = data->p[0];
  fVar15 = powf(10.0,data->p[1] * 0.05);
  SetupImpulse(data,outchannels,length,(state->field_0).field_0.samplerate);
  local_70.mutex = data->mutex;
  Mutex::Lock(local_70.mutex);
  local_58 = 0;
  if (0 < inchannels) {
    local_58 = (ulong)(uint)inchannels;
  }
  local_60 = (long)inchannels << 2;
  local_68 = (long)outchannels << 2;
  uVar6 = 0;
  while (uVar6 != local_58) {
    pCVar1 = data->channels + uVar6;
    pfVar4 = data->channels[uVar6].s;
    numsamples = data->fftsize;
    uVar9 = numsamples - 1;
    uVar12 = data->writeoffset;
    uVar7 = (ulong)(uint)data->hopsize;
    pfVar11 = inbuffer;
    uVar10 = uVar12;
    if (data->hopsize < 1) {
      uVar7 = 0;
    }
    while (uVar7 != 0) {
      pfVar4[(int)uVar10] = *pfVar11;
      uVar7 = uVar7 - 1;
      pfVar11 = (float *)((long)pfVar11 + local_60);
      uVar10 = uVar10 + 1 & uVar9;
    }
    pUVar5 = pCVar1->x[data->bufferindex];
    uVar7 = 0;
    if (0 < (int)numsamples) {
      uVar7 = (ulong)numsamples;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pUVar5[uVar8].re = pfVar4[(int)uVar12];
      pUVar5[uVar8].im = 0.0;
      uVar12 = uVar12 + 1 & uVar9;
    }
    local_48 = uVar6;
    local_40 = inbuffer;
    local_38 = outbuffer;
    FFT::Forward(pUVar5,numsamples,false);
    local_50 = (ulong)(uVar12 + data->hopsize);
    pUVar5 = data->tmpoutput;
    memset(pUVar5,0,(long)data->fftsize << 3);
    for (lVar13 = 0; lVar13 < data->numpartitions; lVar13 = lVar13 + 1) {
      a = pCVar1->h[lVar13];
      b = pCVar1->x[(data->bufferindex + (int)lVar13) % data->numpartitions];
      c = pUVar5;
      for (lVar14 = 0; lVar14 < data->fftsize; lVar14 = lVar14 + 1) {
        UnityComplexNumberT<float>::MulAdd<float,float,float>(a,b,c,c);
        c = c + 1;
        b = b + 1;
        a = a + 1;
      }
    }
    FFT::Backward(pUVar5,data->fftsize,false);
    uVar7 = (ulong)((uint)local_50 & uVar9);
    uVar6 = (ulong)(uint)data->hopsize;
    if (data->hopsize < 1) {
      uVar6 = 0;
    }
    lVar13 = 0;
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      *(float *)((long)local_38 + lVar13) =
           (pUVar5[uVar8].re * fVar15 - *(float *)((long)local_40 + lVar13)) * fVar2 * 0.01 +
           *(float *)((long)local_40 + lVar13);
      lVar13 = lVar13 + local_68;
    }
    inbuffer = local_40 + 1;
    outbuffer = local_38 + 1;
    uVar6 = local_48 + 1;
  }
  iVar3 = data->bufferindex;
  data->bufferindex = iVar3 + -1;
  if (iVar3 < 1) {
    data->bufferindex = data->numpartitions + -1;
  }
  data->writeoffset = (int)uVar7;
  MutexScopeLock::~MutexScopeLock(&local_70);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        const float wet = data->p[P_WET] * 0.01f;
        const float gain = powf(10.0f, 0.05f * data->p[P_GAIN]);

        // this should be done on a separate thread to avoid cpu spikes
        SetupImpulse(data, outchannels, (int)length, state->samplerate);

        // Lock data here in case float parameters are changed in pause/stopped mode and cause further calls to SetupImpulse
        MutexScopeLock mutexScope1(*data->mutex);

        int writeoffset; // set inside loop

        for (int i = 0; i < inchannels; i++)
        {
            Channel& c = data->channels[i];

            // feed new data to input buffer s
            float* s = c.s;
            const int mask = data->fftsize - 1;
            writeoffset = data->writeoffset;
            for (int n = 0; n < data->hopsize; n++)
            {
                s[writeoffset] = inbuffer[n * inchannels + i];
                writeoffset = (writeoffset + 1) & mask;
            }

            // calculate X=FFT(s)
            writeoffset = data->writeoffset;
            UnityComplexNumber* x = c.x[data->bufferindex];
            for (int n = 0; n < data->fftsize; n++)
            {
                x[n].Set(s[writeoffset], 0.0f);
                writeoffset = (writeoffset + 1) & mask;
            }
            FFT::Forward(x, data->fftsize, false);

            writeoffset = (writeoffset + data->hopsize) & mask;

            // calculate y=IFFT(sum(convolve(H_k, X_k), k=1..numpartitions))
            UnityComplexNumber* y = data->tmpoutput;
            memset(y, 0, sizeof(UnityComplexNumber) * data->fftsize);
            for (int k = 0; k < data->numpartitions; k++)
            {
                UnityComplexNumber* h = c.h[k];
                UnityComplexNumber* x = c.x[(k + data->bufferindex) % data->numpartitions];
                for (int n = 0; n < data->fftsize; n++)
                    UnityComplexNumber::MulAdd(h[n], x[n], y[n], y[n]);
            }
            FFT::Backward(y, data->fftsize, false);

            // overlap-save readout
            for (int n = 0; n < data->hopsize; n++)
            {
                float input = inbuffer[n * outchannels + i];
                outbuffer[n * outchannels + i] = input + (gain * y[n].re - input) * wet;
            }
        }

        if (--data->bufferindex < 0)
            data->bufferindex = data->numpartitions - 1;

        data->writeoffset = writeoffset;

        return UNITY_AUDIODSP_OK;
    }